

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O1

Boxed_Number
chaiscript::detail::Cast_Helper<chaiscript::Boxed_Number>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Boxed_Number BVar2;
  Boxed_Value local_18;
  
  local_18.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(param_2->m_conversions)._M_data;
  local_18.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(param_2->m_saves)._M_data;
  if ((Conversion_Saves *)
      local_18.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (Conversion_Saves *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(((Conversion_Saves *)
                local_18.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->saves).
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(((Conversion_Saves *)
                     local_18.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->saves).
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
      UNLOCK();
    }
    else {
      *(int *)&(((Conversion_Saves *)
                local_18.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->saves).
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_start =
           *(int *)&(((Conversion_Saves *)
                     local_18.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->saves).
                    super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
    }
  }
  Boxed_Number::Boxed_Number((Boxed_Number *)ob,&local_18);
  _Var1._M_pi = extraout_RDX;
  if ((Conversion_Saves *)
      local_18.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (Conversion_Saves *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.bv.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)ob;
  return (Boxed_Number)
         BVar2.bv.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Number cast(const Boxed_Value &ob, const Type_Conversions_State *) { return Boxed_Number(ob); }